

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

void __thiscall
MODEL3D::three_dim_model::co_ord_to_path(three_dim_model *this,co_ord *in_vec,Path *out_path)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  Path holder_path;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_68;
  IntPoint local_48;
  
  local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (IntPoint *)0x0;
  local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
  piVar3 = (in_vec->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar1 = (in_vec->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar3 != piVar1) {
    piVar2 = (in_vec->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_48.X = (cInt)*piVar3;
      local_48.Y = (cInt)*piVar2;
      if (local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
        _M_realloc_insert<ClipperLib::IntPoint_const&>
                  ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        (local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->X = local_48.X;
        (local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->Y = local_48.Y;
        local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      piVar2 = piVar2 + 1;
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
            (out_path,&local_68);
  if (local_68.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::co_ord_to_path(  const co_ord &in_vec,
                                                ClipperLib::Path &out_path)
{
    // for each point convert to clipper point
    // then push point to path
    ClipperLib::Path holder_path;
    auto point_it_y = in_vec.y.begin();
    auto point_it_x_end = in_vec.x.end();
    for (auto point_it_x = in_vec.x.begin(); point_it_x != point_it_x_end; point_it_x++)
    {
        ClipperLib::IntPoint current_point;
        current_point.X = *point_it_x;
        current_point.Y = *point_it_y;
        holder_path.push_back(current_point);
        point_it_y++;
    }
    out_path = holder_path;
}